

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void backupUpdate(sqlite3_backup *p,Pgno iPage,u8 *aData)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  
  do {
    if ((((uint)p->rc < 7) && ((0x61U >> (p->rc & 0x1fU) & 1) != 0)) && (iPage < p->iNext)) {
      psVar1 = p->pDestDb->mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar1);
      }
      iVar2 = backupOnePage(p,iPage,aData,1);
      psVar1 = p->pDestDb->mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar1);
      }
      if (iVar2 != 0) {
        p->rc = iVar2;
      }
    }
    p = p->pNext;
  } while (p != (sqlite3_backup *)0x0);
  return;
}

Assistant:

static SQLITE_NOINLINE void backupUpdate(
  sqlite3_backup *p,
  Pgno iPage,
  const u8 *aData
){
  assert( p!=0 );
  do{
    assert( sqlite3_mutex_held(p->pSrc->pBt->mutex) );
    if( !isFatalError(p->rc) && iPage<p->iNext ){
      /* The backup process p has already copied page iPage. But now it
      ** has been modified by a transaction on the source pager. Copy
      ** the new data into the backup.
      */
      int rc;
      assert( p->pDestDb );
      sqlite3_mutex_enter(p->pDestDb->mutex);
      rc = backupOnePage(p, iPage, aData, 1);
      sqlite3_mutex_leave(p->pDestDb->mutex);
      assert( rc!=SQLITE_BUSY && rc!=SQLITE_LOCKED );
      if( rc!=SQLITE_OK ){
        p->rc = rc;
      }
    }
  }while( (p = p->pNext)!=0 );
}